

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternEditor.cpp
# Opt level: O1

void __thiscall PatternEditor::transpose(PatternEditor *this)

{
  PatternModel *this_00;
  int iVar1;
  undefined4 *puVar2;
  QSlotObjectBase local_108;
  code *local_f8;
  undefined8 local_f0;
  QSpinBox transposeSpin;
  QObject local_c0 [8];
  QObject local_b8 [8];
  QLabel label;
  QVBoxLayout layout;
  QDialog dialog;
  QDialogButtonBox buttons;
  
  QDialog::QDialog(&dialog,this,0x8003000);
  QMetaObject::tr((char *)&label,(char *)&staticMetaObject,0x1b5690);
  QWidget::setWindowTitle((QString *)&dialog);
  if (_label != (QArrayData *)0x0) {
    LOCK();
    (_label->ref_)._q_value.super___atomic_base<int>._M_i =
         (_label->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((_label->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(_label,2,8);
    }
  }
  QVBoxLayout::QVBoxLayout(&layout);
  QMetaObject::tr((char *)&transposeSpin,(char *)&staticMetaObject,0x1b7fdc);
  QLabel::QLabel(&label,&transposeSpin,0,0);
  if (_transposeSpin != (QArrayData *)0x0) {
    LOCK();
    (_transposeSpin->ref_)._q_value.super___atomic_base<int>._M_i =
         (_transposeSpin->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((_transposeSpin->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(_transposeSpin,2,8);
    }
  }
  QSpinBox::QSpinBox(&transposeSpin,(QWidget *)0x0);
  QDialogButtonBox::QDialogButtonBox(&buttons,0x400400,0);
  QBoxLayout::addWidget(&layout,&label,0,0);
  QBoxLayout::addWidget(&layout,&transposeSpin,0,0);
  QBoxLayout::addWidget(&layout,&buttons,0,0);
  QLayout::setSizeConstraint((SizeConstraint)&layout);
  QWidget::setLayout((QLayout *)&dialog);
  QSpinBox::setRange((int)&transposeSpin,-0x53);
  local_f8 = QDialogButtonBox::accepted;
  local_f0 = 0;
  local_108.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1b9;
  local_108._4_4_ = 0;
  local_108.m_impl = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar2 + 4) = 0x1b9;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_b8,(void **)&buttons,(QObject *)&local_f8,(void **)&dialog,&local_108,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  local_f8 = QDialogButtonBox::rejected;
  local_f0 = 0;
  local_108.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c1;
  local_108._4_4_ = 0;
  local_108.m_impl = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar2 + 4) = 0x1c1;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)&buttons,(QObject *)&local_f8,(void **)&dialog,&local_108,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  iVar1 = QDialog::exec();
  if (iVar1 == 1) {
    this_00 = this->mModel;
    iVar1 = QSpinBox::value();
    PatternModel::transpose(this_00,iVar1);
  }
  QDialogButtonBox::~QDialogButtonBox(&buttons);
  QSpinBox::~QSpinBox(&transposeSpin);
  QLabel::~QLabel(&label);
  QVBoxLayout::~QVBoxLayout(&layout);
  QDialog::~QDialog(&dialog);
  return;
}

Assistant:

void PatternEditor::transpose() {
    QDialog dialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
    dialog.setWindowTitle(tr("Transpose"));

    QVBoxLayout layout;
        QLabel label(tr("Enter transpose amount (semitones):"));
        QSpinBox transposeSpin;
        QDialogButtonBox buttons(QDialogButtonBox::Ok | QDialogButtonBox::Cancel);
    
    layout.addWidget(&label);
    layout.addWidget(&transposeSpin);
    layout.addWidget(&buttons);
    layout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    dialog.setLayout(&layout);

    transposeSpin.setRange(-trackerboy::NOTE_LAST, trackerboy::NOTE_LAST);

    connect(&buttons, &QDialogButtonBox::accepted, &dialog, &QDialog::accept);
    connect(&buttons, &QDialogButtonBox::rejected, &dialog, &QDialog::reject);

    if (dialog.exec() == QDialog::Accepted) {
        mModel.transpose(transposeSpin.value());
    }
}